

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O0

void __thiscall
jsonnet::internal::StaticError::StaticError
          (StaticError *this,string *filename,Location *location,string *msg)

{
  string *in_RCX;
  Location *in_RDX;
  Location *in_RSI;
  string *in_RDI;
  LocationRange *in_stack_ffffffffffffffc0;
  
  Location::successor((Location *)0x37785a);
  LocationRange::LocationRange(in_stack_ffffffffffffffc0,in_RDI,in_RDX,in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RCX);
  return;
}

Assistant:

StaticError(const std::string &filename, const Location &location, const std::string &msg)
        : location(filename, location, location.successor()), msg(msg)
    {
    }